

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5HashScanInit(Fts5Hash *p,char *pTerm,int nTerm)

{
  int iVar1;
  int in_stack_0000001c;
  char *in_stack_00000020;
  Fts5Hash *in_stack_00000028;
  
  iVar1 = fts5HashEntrySort(in_stack_00000028,in_stack_00000020,in_stack_0000001c,
                            (Fts5HashEntry **)p);
  return iVar1;
}

Assistant:

static int sqlite3Fts5HashScanInit(
  Fts5Hash *p,                    /* Hash table to query */
  const char *pTerm, int nTerm    /* Query prefix */
){
  return fts5HashEntrySort(p, pTerm, nTerm, &p->pScan);
}